

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::PositionalList<double,_args::detail::vector,_args::ValueReader>::~PositionalList
          (PositionalList<double,_args::detail::vector,_args::ValueReader> *this)

{
  PositionalList<double,_args::detail::vector,_args::ValueReader> *this_local;
  
  ~PositionalList(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~PositionalList() {}